

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldDefault_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  _anonymous_namespace_ _Var1;
  byte bVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint uVar5;
  string *extraout_RAX;
  EnumValueDescriptor *pEVar6;
  string *extraout_RAX_00;
  LogMessage *pLVar7;
  string *extraout_RAX_01;
  undefined8 *puVar8;
  string *psVar9;
  string *extraout_RAX_02;
  long *plVar10;
  string *extraout_RAX_03;
  ushort uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type *psVar13;
  ushort uVar14;
  char *pcVar15;
  ushort uVar16;
  protobuf *this_00;
  char *pcVar17;
  char cVar18;
  string *psVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  string out;
  string result;
  undefined1 local_98 [39];
  LogFinisher local_71;
  undefined1 local_70 [16];
  string local_60;
  string *local_38;
  
  if (*(int *)(this + 0x3c) == 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[]","");
    return extraout_RAX;
  }
  this_00 = (protobuf *)this;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    this_00 = (protobuf *)local_70;
    local_70._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98._0_8_ = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)this_00,
               (FieldDescriptor **)local_98);
  }
  uVar5 = *(uint *)(this + 0x38);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar5 * 4)) {
  case 1:
    local_70._0_8_ = &local_60;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),(char *)&local_60);
    local_70._8_8_ = local_70._8_8_ + -(long)&local_60;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    psVar9 = anon_unknown_0::MaybeNumberString
                       (__return_storage_ptr__,(FieldDescriptor *)this,(string *)local_98);
    break;
  case 2:
    local_70._0_8_ = &local_60;
    local_70._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),(char *)&local_60);
    local_70._8_8_ = local_70._8_8_ + -(long)&local_60;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    psVar9 = anon_unknown_0::MaybeNumberString
                       (__return_storage_ptr__,(FieldDescriptor *)this,(string *)local_98);
    break;
  case 3:
    local_70._0_8_ = &local_60;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(this + 0x90),(char *)&local_60);
    local_70._8_8_ = local_70._8_8_ + -(long)&local_60;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    psVar9 = anon_unknown_0::MaybeNumberString
                       (__return_storage_ptr__,(FieldDescriptor *)this,(string *)local_98);
    break;
  case 4:
    local_70._0_8_ = &local_60;
    local_70._8_8_ = FastInt64ToBufferLeft(*(int64 *)(this + 0x90),(char *)&local_60);
    local_70._8_8_ = local_70._8_8_ + -(long)&local_60;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    psVar9 = anon_unknown_0::MaybeNumberString
                       (__return_storage_ptr__,(FieldDescriptor *)this,(string *)local_98);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_((string *)local_70,this_00,*(double *)(this + 0x90));
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,(string *)local_98);
    goto LAB_0024ca14;
  case 6:
    SimpleFtoa_abi_cxx11_((string *)local_70,this_00,*(float *)(this + 0x90));
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_70._0_8_,(char *)(local_70._8_8_ + local_70._0_8_));
    anon_unknown_0::PostProcessFloat(__return_storage_ptr__,(string *)local_98);
LAB_0024ca14:
    if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    psVar19 = (string *)local_70._0_8_;
    if ((string *)local_70._0_8_ == &local_60) {
      return &local_60;
    }
    goto LAB_0024ca34;
  case 7:
    _Var1 = this[0x90];
    pcVar17 = "false";
    if ((ulong)(byte)_Var1 != 0) {
      pcVar17 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar15 = (char *)((long)&(((string *)pcVar17)->_M_dataplus)._M_p + ((ulong)(byte)_Var1 ^ 5));
    goto LAB_0024cac4;
  case 8:
    pEVar6 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    local_70._0_8_ = &local_60;
    local_70._8_8_ = FastInt32ToBufferLeft(*(int32 *)(pEVar6 + 0x10),(char *)&local_60);
    local_70._8_8_ = local_70._8_8_ + -(long)&local_60;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar15 = (char *)(local_70._8_8_ + local_70._0_8_);
    pcVar17 = (char *)local_70._0_8_;
    goto LAB_0024cac4;
  case 9:
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_70._0_8_ = FieldDescriptor::TypeOnceInit;
      local_98._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_70,
                 (FieldDescriptor **)local_98);
      uVar5 = *(uint *)(this + 0x38);
    }
    local_98._0_8_ = local_98 + 0x10;
    cVar18 = (char)local_98;
    if (uVar5 == 9) {
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      plVar10 = *(long **)(this + 0x90);
      uVar23 = plVar10[1];
      if (uVar23 != 0) {
        uVar21 = 0;
        do {
          lVar20 = *plVar10;
          if (uVar21 + 1 < uVar23) {
            uVar11 = *(byte *)(lVar20 + uVar21 + 1) & 0x3f;
          }
          else {
            uVar11 = 0;
          }
          if (uVar21 + 2 < uVar23) {
            uVar16 = *(byte *)(lVar20 + uVar21 + 2) & 0x3f;
          }
          else {
            uVar16 = 0;
          }
          bVar2 = *(byte *)(lVar20 + uVar21);
          uVar14 = (ushort)bVar2;
          if ((char)bVar2 < '\0') {
            if ((bVar2 & 0xe0) == 0xc0) {
              if (uVar23 - uVar21 == 1) {
LAB_0024cefe:
                internal::LogMessage::LogMessage
                          ((LogMessage *)local_70,LOGLEVEL_WARNING,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                           ,0x356);
                pLVar7 = internal::LogMessage::operator<<
                                   ((LogMessage *)local_70,"The default value for field ");
                pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(this + 8));
                pLVar7 = internal::LogMessage::operator<<
                                   (pLVar7,
                                    " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                                   );
                internal::LogFinisher::operator=(&local_71,pLVar7);
                internal::LogMessage::~LogMessage((LogMessage *)local_70);
                break;
              }
              uVar14 = uVar11 | (bVar2 & 0x1f) << 6;
              lVar20 = 2;
            }
            else {
              if ((uVar23 - uVar21 < 3) || ((bVar2 & 0xf0) != 0xe0)) goto LAB_0024cefe;
              uVar14 = uVar16 | uVar11 << 6 | (ushort)bVar2 << 0xc;
              lVar20 = 3;
            }
          }
          else {
            lVar20 = 1;
          }
          if (0x25 < uVar14) {
            if (uVar14 < 0x3d) {
              if (((uVar14 != 0x26) && (uVar14 != 0x27)) && (uVar14 != 0x3c))
              goto switchD_0024cbf7_caseD_b;
            }
            else if (((uVar14 != 0x3d) && (uVar14 != 0x3e)) && (uVar14 != 0x5c))
            goto switchD_0024cbf7_caseD_b;
            goto LAB_0024cca6;
          }
          switch(uVar14) {
          case 8:
            break;
          case 9:
            break;
          case 10:
            break;
          case 0xb:
switchD_0024cbf7_caseD_b:
            if ((ushort)(uVar14 - 0x20) < 0x5f) {
              std::__cxx11::string::push_back(cVar18);
            }
            else {
              if (uVar14 < 0x100) {
                StringPrintf_abi_cxx11_((string *)local_70,"\\x%02x");
                std::__cxx11::string::_M_append(local_98,local_70._0_8_);
              }
              else {
                StringPrintf_abi_cxx11_((string *)local_70,"\\u%04x");
                std::__cxx11::string::_M_append(local_98,local_70._0_8_);
              }
              if ((string *)local_70._0_8_ != &local_60) {
                operator_delete((void *)local_70._0_8_);
              }
            }
            goto LAB_0024ccae;
          case 0xc:
            break;
          case 0xd:
            break;
          default:
            if (uVar14 != 0x22) goto switchD_0024cbf7_caseD_b;
          }
LAB_0024cca6:
          std::__cxx11::string::append(local_98);
LAB_0024ccae:
          uVar21 = uVar21 + lVar20;
          uVar23 = plVar10[1];
        } while (uVar21 < uVar23);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98);
      plVar10 = (long *)std::__cxx11::string::append(local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar13 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar13) {
        lVar20 = plVar10[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar20;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
      }
      __return_storage_ptr__->_M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      psVar9 = &local_60;
      if ((string *)local_70._0_8_ != psVar9) {
        operator_delete((void *)local_70._0_8_);
        psVar9 = extraout_RAX_03;
      }
      psVar19 = (string *)local_98._0_8_;
      if ((string *)local_98._0_8_ == (string *)(local_98 + 0x10)) {
        return psVar9;
      }
    }
    else {
      lVar20 = *(long *)(this + 0x90);
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_38 = __return_storage_ptr__;
      if (*(long *)(lVar20 + 8) != 0) {
        lVar22 = 2;
        do {
          std::__cxx11::string::push_back(cVar18);
          std::__cxx11::string::push_back(cVar18);
          std::__cxx11::string::push_back(cVar18);
          std::__cxx11::string::push_back(cVar18);
          uVar23 = lVar22 + 1;
          lVar22 = lVar22 + 3;
        } while (uVar23 < *(ulong *)(lVar20 + 8));
      }
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x395884);
      psVar19 = local_38;
      psVar9 = (string *)(puVar8 + 2);
      if ((string *)*puVar8 == psVar9) {
        local_60._M_dataplus._M_p = (psVar9->_M_dataplus)._M_p;
        local_60._M_string_length = puVar8[3];
        local_70._0_8_ = &local_60;
      }
      else {
        local_60._M_dataplus._M_p = (psVar9->_M_dataplus)._M_p;
        local_70._0_8_ = (string *)*puVar8;
      }
      local_70._8_8_ = puVar8[1];
      *puVar8 = psVar9;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      psVar9 = (string *)std::__cxx11::string::append(local_70);
      (psVar19->_M_dataplus)._M_p = (pointer)&psVar19->field_2;
      pcVar3 = (psVar9->_M_dataplus)._M_p;
      paVar12 = &psVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar12) {
        uVar4 = *(undefined8 *)((long)&psVar9->field_2 + 8);
        (psVar19->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
        *(undefined8 *)((long)&psVar19->field_2 + 8) = uVar4;
      }
      else {
        (psVar19->_M_dataplus)._M_p = pcVar3;
        (psVar19->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      psVar19->_M_string_length = psVar9->_M_string_length;
      (psVar9->_M_dataplus)._M_p = (pointer)paVar12;
      psVar9->_M_string_length = 0;
      (psVar9->field_2)._M_local_buf[0] = '\0';
      if ((string *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_);
        psVar9 = extraout_RAX_02;
      }
      psVar19 = (string *)local_98._0_8_;
      if ((string *)local_98._0_8_ == (string *)(local_98 + 0x10)) {
        return psVar9;
      }
    }
    goto LAB_0024ca34;
  case 10:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar15 = "";
    pcVar17 = (char *)(string *)0x398cfa;
    goto LAB_0024cac4;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x361);
    pLVar7 = internal::LogMessage::operator<<((LogMessage *)local_70,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)local_98,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar15 = "";
    pcVar17 = (char *)(string *)0x38f545;
LAB_0024cac4:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar17,pcVar15);
    return extraout_RAX_01;
  }
  psVar19 = (string *)local_98._0_8_;
  if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
LAB_0024ca34:
    operator_delete(psVar19);
    psVar9 = extraout_RAX_00;
  }
  return psVar9;
}

Assistant:

std::string JSFieldDefault(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return "[]";
  }

  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int32()));
    case FieldDescriptor::CPPTYPE_UINT32:
      // The original codegen is in Java, and Java protobufs store unsigned
      // integer values as signed integer values. In order to exactly match the
      // output, we need to reinterpret as base-2 signed. Ugh.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int32>(field->default_value_uint32())));
    case FieldDescriptor::CPPTYPE_INT64:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int64()));
    case FieldDescriptor::CPPTYPE_UINT64:
      // See above note for uint32 -- reinterpreting as signed.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int64>(field->default_value_uint64())));
    case FieldDescriptor::CPPTYPE_ENUM:
      return StrCat(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return FloatToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return DoubleToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        std::string out;
        bool is_valid = EscapeJSString(field->default_value_string(), &out);
        if (!is_valid) {
          // TODO(b/115551870): Decide whether this should be a hard error.
          GOOGLE_LOG(WARNING) << "The default value for field " << field->full_name()
                       << " was truncated since it contained invalid UTF-8 or"
                          " codepoints outside the basic multilingual plane.";
        }
        return "\"" + out + "\"";
      } else {  // Bytes
        return "\"" + EscapeBase64(field->default_value_string()) + "\"";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";
  }
  GOOGLE_LOG(FATAL) << "Shouldn't reach here.";
  return "";
}